

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# die_if_null.cc
# Opt level: O3

void absl::lts_20240722::log_internal::DieBecauseNull(char *file,int line,char *exprtext)

{
  size_t sVar1;
  LogMessage *this;
  LogMessageFatal local_e0 [16];
  undefined1 local_d0 [40];
  char *local_a8;
  undefined8 local_80;
  char *local_78;
  AlphaNum local_50;
  
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_e0,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/log/die_if_null.cc"
             ,0x1a);
  sVar1 = strlen(file);
  this = (LogMessage *)
         absl::lts_20240722::log_internal::LogMessage::AtLocation(local_e0,sVar1,file,line);
  local_d0[0x20] = '\x0f';
  local_d0[0x21] = '\0';
  local_d0[0x22] = '\0';
  local_d0[0x23] = '\0';
  local_d0[0x24] = '\0';
  local_d0[0x25] = '\0';
  local_d0[0x26] = '\0';
  local_d0[0x27] = '\0';
  local_a8 = "Check failed: \'";
  if (exprtext == (char *)0x0) {
    local_50.piece_._M_len = 0;
  }
  else {
    local_50.piece_._M_len = strlen(exprtext);
  }
  local_80 = 0x12;
  local_78 = "\' Must be non-null";
  local_50.piece_._M_str = exprtext;
  absl::lts_20240722::StrCat_abi_cxx11_
            ((AlphaNum *)local_d0,(AlphaNum *)(local_d0 + 0x20),&local_50);
  absl::lts_20240722::log_internal::LogMessage::operator<<(this,(string *)local_d0);
  std::__cxx11::string::~string((string *)local_d0);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_e0);
  halt_baddata();
}

Assistant:

void DieBecauseNull(const char* file, int line, const char* exprtext) {
  LOG(FATAL).AtLocation(file, line)
      << absl::StrCat("Check failed: '", exprtext, "' Must be non-null");
}